

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void __thiscall TCMallocGuard::TCMallocGuard(TCMallocGuard *this)

{
  bool bVar1;
  void *pvVar2;
  int iVar3;
  TCMallocGuard *this_local;
  
  iVar3 = tcmallocguard_refcount + 1;
  bVar1 = tcmallocguard_refcount < 1;
  tcmallocguard_refcount = iVar3;
  if (bVar1) {
    ReplaceSystemAlloc();
    MallocExtension::instance();
    pvVar2 = tc_malloc(1);
    operator_delete__(pvVar2);
    tcmalloc::ThreadCachePtr::InitThreadCachePtrLate();
    pvVar2 = tc_malloc(1);
    operator_delete__(pvVar2);
  }
  return;
}

Assistant:

TCMallocGuard::TCMallocGuard() {
  if (tcmallocguard_refcount++ > 0) {
    return;
  }

#ifndef WIN32_OVERRIDE_ALLOCATORS
  ReplaceSystemAlloc();    // defined in libc_override_*.h
  (void)MallocExtension::instance(); // make sure malloc extension is constructed
  tc_free(tc_malloc(1));
#endif  // !WIN32_OVERRIDE_ALLOCATORS

  ThreadCachePtr::InitThreadCachePtrLate();
  tc_free(tc_malloc(1));
}